

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

pair<ska::detailv3::sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>::templated_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>>>
::emplace_new_key<std::basic_string_view<char,std::char_traits<char>>>
          (sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,
          basic_string_view<char,_std::char_traits<char>_> *key)

{
  size_t sVar1;
  char *pcVar2;
  sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>>>
  sVar3;
  long lVar4;
  EntryPointer psVar5;
  EntryPointer psVar6;
  char cVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  pair<ska::detailv3::sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>::templated_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>,_bool>
  pVar10;
  value_type to_insert;
  basic_string_view<char,_std::char_traits<char>_> __tmp_1;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  size_t local_28;
  char *pcStack_20;
  
  if ((*(long *)(this + 8) != 0) &&
     (this[0x11] !=
      (sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>>>
       )distance_from_desired)) {
    psVar5 = (EntryPointer)(*(long *)(this + 0x18) + 1);
    auVar8._8_4_ = (int)((ulong)psVar5 >> 0x20);
    auVar8._0_8_ = psVar5;
    auVar8._12_4_ = 0x45300000;
    lVar4 = *(long *)(this + 8) + 1;
    auVar9._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar9._0_8_ = lVar4;
    auVar9._12_4_ = 0x45300000;
    if ((auVar8._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)psVar5) - 4503599627370496.0) <=
        (double)*(float *)(this + 0x14) *
        ((auVar9._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0))) {
      cVar7 = current_entry->distance_from_desired;
      if (cVar7 < '\0') {
        pcVar2 = key->_M_str;
        (current_entry->field_1).value._M_len = key->_M_len;
        (current_entry->field_1).value._M_str = pcVar2;
        current_entry->distance_from_desired = distance_from_desired;
      }
      else {
        sVar1 = key->_M_len;
        pcVar2 = key->_M_str;
        current_entry->distance_from_desired = distance_from_desired;
        local_38._M_len = (current_entry->field_1).value._M_len;
        local_38._M_str = (current_entry->field_1).value._M_str;
        (current_entry->field_1).value._M_len = sVar1;
        (current_entry->field_1).value._M_str = pcVar2;
        sVar3 = (sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>>>
                 )(cVar7 + '\x01');
        psVar5 = current_entry + 1;
        cVar7 = current_entry[1].distance_from_desired;
        psVar6 = current_entry;
        if (-1 < cVar7) {
          do {
            psVar6 = psVar5;
            if (cVar7 < (char)sVar3) {
              psVar6->distance_from_desired = (int8_t)sVar3;
              sVar1 = (psVar6->field_1).value._M_len;
              pcVar2 = (psVar6->field_1).value._M_str;
              (psVar6->field_1).value._M_len = local_38._M_len;
              (psVar6->field_1).value._M_str = local_38._M_str;
              sVar3 = (sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>>>
                       )(cVar7 + '\x01');
              local_38._M_len = sVar1;
              local_38._M_str = pcVar2;
            }
            else {
              sVar3 = (sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>>>
                       )((char)sVar3 + '\x01');
              if (sVar3 == this[0x11]) {
                local_28 = local_38._M_len;
                pcStack_20 = local_38._M_str;
                sVar1 = (current_entry->field_1).value._M_len;
                pcVar2 = (current_entry->field_1).value._M_str;
                (current_entry->field_1).value._M_len = local_38._M_len;
                (current_entry->field_1).value._M_str = local_38._M_str;
                key = &local_38;
                local_38._M_len = sVar1;
                local_38._M_str = pcVar2;
                goto LAB_00171d4f;
              }
            }
            cVar7 = psVar6[1].distance_from_desired;
            psVar5 = psVar6 + 1;
          } while (-1 < cVar7);
        }
        psVar6[1].field_1.value._M_len = local_38._M_len;
        psVar6[1].field_1.value._M_str = local_38._M_str;
        psVar5->distance_from_desired = (int8_t)sVar3;
      }
      *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
      pVar10._9_7_ = (int7)((ulong)psVar5 >> 8);
      pVar10.second = true;
      pVar10.first.current = current_entry;
      return pVar10;
    }
  }
LAB_00171d4f:
  sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::grow((sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          *)this);
  pVar10 = emplace<std::basic_string_view<char,std::char_traits<char>>>(this,key);
  return pVar10;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }